

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

string * leveldb::anon_unknown_1::PosixWritableFile::Dirname(string *filename)

{
  size_type sVar1;
  string *in_RDI;
  long in_FS_OFFSET;
  size_type separator_pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  string *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  this = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (in_FS_OFFSET + 0x28);
  __a = in_RDI;
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (in_stack_ffffffffffffffc8,(char)((ulong)in_stack_ffffffffffffffd8 >> 0x38),
                     (size_type)in_RDI);
  if (sVar1 == 0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)in_stack_fffffffffffffff0,(allocator<char> *)__a);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff7);
  }
  else {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (in_stack_fffffffffffffff0,(char)((ulong)this >> 0x38),(size_type)__a);
    if (sVar1 != 0xffffffffffffffff) {
      __assert_fail("filename.find(\'/\', separator_pos + 1) == std::string::npos",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/env_posix.cc"
                    ,0x19d,
                    "static std::string leveldb::(anonymous namespace)::PosixWritableFile::Dirname(const std::string &)"
                   );
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8,(size_type)in_RDI);
  }
  if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_FS_OFFSET + 0x28)
      == this) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static std::string Dirname(const std::string& filename) {
    std::string::size_type separator_pos = filename.rfind('/');
    if (separator_pos == std::string::npos) {
      return std::string(".");
    }
    // The filename component should not contain a path separator. If it does,
    // the splitting was done incorrectly.
    assert(filename.find('/', separator_pos + 1) == std::string::npos);

    return filename.substr(0, separator_pos);
  }